

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O0

void __thiscall
pbrt::BDPTIntegrator::BDPTIntegrator
          (BDPTIntegrator *this,Camera *camera,Sampler *sampler,Primitive *aggregate,
          vector<pbrt::Light,_std::allocator<pbrt::Light>_> *lights,int maxDepth,
          bool visualizeStrategies,bool visualizeWeights,bool regularize)

{
  polymorphic_allocator<std::byte> *this_00;
  span<const_pbrt::Light> *in_RCX;
  vector<pbrt::Light,_std::allocator<pbrt::Light>_> *in_RDX;
  undefined8 *in_RDI;
  undefined4 in_R9D;
  byte in_stack_00000008;
  byte in_stack_00000010;
  byte in_stack_00000018;
  PowerLightSampler *in_stack_00000188;
  Allocator in_stack_00000190;
  undefined1 in_stack_00000198 [16];
  Sampler *in_stack_ffffffffffffff28;
  PowerLightSampler *pPVar1;
  Sampler *in_stack_ffffffffffffff30;
  vector<pbrt::Light,_std::allocator<pbrt::Light>_> *in_stack_ffffffffffffff78;
  vector<pbrt::Light,_std::allocator<pbrt::Light>_> *in_stack_ffffffffffffff80;
  vector<pbrt::Light,_std::allocator<pbrt::Light>_> *in_stack_ffffffffffffffa0;
  Primitive *in_stack_ffffffffffffffa8;
  Sampler *in_stack_ffffffffffffffb0;
  Camera *in_stack_ffffffffffffffb8;
  RayIntegrator *in_stack_ffffffffffffffc0;
  
  Camera::Camera((Camera *)in_stack_ffffffffffffff30,(Camera *)in_stack_ffffffffffffff28);
  Sampler::Sampler(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  Primitive::Primitive
            ((Primitive *)in_stack_ffffffffffffff30,(Primitive *)in_stack_ffffffffffffff28);
  std::vector<pbrt::Light,_std::allocator<pbrt::Light>_>::vector
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  RayIntegrator::RayIntegrator
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::vector<pbrt::Light,_std::allocator<pbrt::Light>_>::~vector
            ((vector<pbrt::Light,_std::allocator<pbrt::Light>_> *)in_RCX);
  *in_RDI = &PTR__BDPTIntegrator_03743ee0;
  *(undefined4 *)(in_RDI + 10) = in_R9D;
  *(byte *)((long)in_RDI + 0x54) = in_stack_00000018 & 1;
  pPVar1 = (PowerLightSampler *)(in_RDI + 0xb);
  this_00 = (polymorphic_allocator<std::byte> *)operator_new(0x68);
  pstd::span<const_pbrt::Light>::span<pbrt::Light>(in_RCX,in_RDX);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator(this_00);
  PowerLightSampler::PowerLightSampler
            (in_stack_00000188,(span<const_pbrt::Light>)in_stack_00000198,in_stack_00000190);
  LightSampler::TaggedPointer<pbrt::PowerLightSampler>((LightSampler *)this_00,pPVar1);
  *(byte *)(in_RDI + 0xc) = in_stack_00000008 & 1;
  *(byte *)((long)in_RDI + 0x61) = in_stack_00000010 & 1;
  std::vector<pbrt::Film,_std::allocator<pbrt::Film>_>::vector
            ((vector<pbrt::Film,_std::allocator<pbrt::Film>_> *)0x697667);
  return;
}

Assistant:

BDPTIntegrator(Camera camera, Sampler sampler, Primitive aggregate,
                   std::vector<Light> lights, int maxDepth, bool visualizeStrategies,
                   bool visualizeWeights, bool regularize = false)
        : RayIntegrator(camera, sampler, aggregate, lights),
          maxDepth(maxDepth),
          regularize(regularize),
          lightSampler(new PowerLightSampler(lights, Allocator())),
          visualizeStrategies(visualizeStrategies),
          visualizeWeights(visualizeWeights) {}